

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcBinaryStream.h
# Opt level: O2

void __thiscall GrcDiversion::undivert(GrcDiversion *this)

{
  iostream *piVar1;
  long local_58 [4];
  string local_38 [32];
  
  if (this->m_sbSaved != (streambuf *)0x0) {
    std::ostream::flush();
    std::ios::rdbuf((streambuf *)
                    ((long)&(this->m_strm->super_basic_istream<char,_std::char_traits<char>_>).
                            _vptr_basic_istream +
                    (long)(this->m_strm->super_basic_istream<char,_std::char_traits<char>_>).
                          _vptr_basic_istream[-3]));
    piVar1 = this->m_strm;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::ostream::write(&(piVar1->super_basic_istream<char,_std::char_traits<char>_>).field_0x10,
                        local_58[0]);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)local_58);
    std::ostream::flush();
    std::__cxx11::string::string((string *)local_58,"",(allocator *)local_38);
    std::__cxx11::stringbuf::str((string *)this);
    std::__cxx11::string::~string((string *)local_58);
    this->m_sbSaved = (streambuf *)0x0;
  }
  return;
}

Assistant:

void undivert()
    {
        if (m_sbSaved)
        {
            m_strm.flush();
            m_strm.rdbuf(m_sbSaved);
            m_strm.write(str().data(), str().size());
            m_strm.flush();
            str("");
            m_sbSaved = 0;
        }
    }